

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalCSE.cpp
# Opt level: O1

void __thiscall wasm::anon_unknown_236::Checker::visitExpression(Checker *this,Expression *curr)

{
  RequestInfo *this_00;
  key_type *__k;
  _Base_ptr p_Var1;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
  *__k_00;
  _Rb_tree_header *p_Var2;
  _Rb_tree_header *p_Var3;
  _Rb_tree_header *p_Var4;
  _Rb_tree_header *p_Var5;
  _Rb_tree_header *p_Var6;
  __node_base *p_Var7;
  size_type *psVar8;
  int iVar9;
  PassOptions *pPVar10;
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_01;
  __node_ptr p_Var11;
  key_type pEVar12;
  __buckets_ptr pp_Var13;
  long lVar14;
  undefined8 *puVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *psVar18;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *psVar19;
  pointer ppEVar20;
  undefined4 uVar21;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var22;
  bool bVar23;
  __node_base_ptr p_Var24;
  _Hash_node_base *p_Var25;
  mapped_type *pmVar26;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
  *this_02;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
  *p_Var27;
  __node_base_ptr p_Var28;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var29;
  Expression *in_RCX;
  __node_ptr __prev_n;
  Expression *pEVar30;
  ulong uVar31;
  ulong uVar32;
  __node_ptr __bkt;
  size_type __n_00;
  __node_ptr __n_01;
  _Hash_node_base _Var33;
  __node_ptr p_Var34;
  __node_base_ptr p_Var35;
  __node_base_ptr p_Var36;
  undefined1 auVar37 [8];
  __node_ptr __n;
  __node_ptr __n_02;
  undefined1 auVar38 [16];
  undefined1 auStack_338 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> invalidated;
  FeatureSet FStack_318;
  bool local_314;
  bool local_313;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_310;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_2e0;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_2b0;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_280;
  bool local_250;
  bool bStack_24f;
  bool bStack_24e;
  bool bStack_24d;
  bool bStack_24c;
  bool bStack_24b;
  bool bStack_24a;
  bool bStack_249;
  bool bStack_248;
  bool bStack_247;
  bool bStack_246;
  bool bStack_245;
  undefined4 uStack_244;
  size_t local_240;
  size_t sStack_238;
  bool local_230;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_228;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_1f8;
  undefined1 local_1c8 [8];
  EffectAnalyzer effects;
  _Hash_node_base local_48;
  Expression *curr_local;
  Expression *original;
  unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>_>
  *__range3;
  
  uVar21 = local_1c8._0_4_;
  uVar32 = (this->activeOriginals)._M_h._M_bucket_count;
  pEVar30 = (Expression *)((ulong)curr % uVar32);
  p_Var35 = (this->activeOriginals)._M_h._M_buckets[(long)pEVar30];
  p_Var24 = (__node_base_ptr)0x0;
  if ((p_Var35 != (__node_base_ptr)0x0) &&
     (p_Var25 = p_Var35->_M_nxt, p_Var24 = p_Var35, (Expression *)p_Var35->_M_nxt[1]._M_nxt != curr)
     ) {
    while (p_Var35 = p_Var25, p_Var25 = p_Var35->_M_nxt, in_RCX = pEVar30,
          p_Var25 != (_Hash_node_base *)0x0) {
      p_Var24 = (__node_base_ptr)0x0;
      if (((Expression *)((ulong)p_Var25[1]._M_nxt % uVar32) != pEVar30) ||
         (p_Var24 = p_Var35, (Expression *)p_Var25[1]._M_nxt == curr)) goto LAB_0077e7b7;
    }
    p_Var24 = (__node_base_ptr)0x0;
  }
LAB_0077e7b7:
  local_48._M_nxt = (_Hash_node_base *)curr;
  if ((p_Var24 != (__node_base_ptr)0x0) && (p_Var24->_M_nxt != (_Hash_node_base *)0x0)) {
    __assert_fail("!activeOriginals.count(curr)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/LocalCSE.cpp"
                  ,0x178,"void wasm::(anonymous namespace)::Checker::visitExpression(Expression *)")
    ;
  }
  original = (Expression *)&this->activeOriginals;
  if ((this->activeOriginals)._M_h._M_element_count != 0) {
    effects.funcEffectsMap.
    super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (this->
         super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
         ).
         super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
         .
         super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
         .currModule;
    pPVar10 = this->options;
    uVar16 = pPVar10->ignoreImplicitTraps;
    uVar17 = pPVar10->trapsNeverHappen;
    local_1c8[1] = uVar17;
    local_1c8[0] = uVar16;
    local_1c8._2_2_ = SUB42(uVar21,2);
    effects._0_8_ =
         (pPVar10->funcEffectsMap).
         super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    effects.funcEffectsMap.
    super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              (pPVar10->funcEffectsMap).
              super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        effects.funcEffectsMap.
        super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        effects.funcEffectsMap.
        super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             effects.funcEffectsMap.
             super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        effects.funcEffectsMap.
        super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             effects.funcEffectsMap.
             super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->_M_use_count + 1;
      }
    }
    effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&effects.localsRead;
    effects.module._0_4_ =
         (((Module *)
          effects.funcEffectsMap.
          super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi)->features).features;
    effects.module._4_2_ = 0;
    effects.localsRead._M_t._M_impl._0_4_ = 0;
    effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&effects.localsWritten;
    effects.localsWritten._M_t._M_impl._0_4_ = 0;
    effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&effects.mutableGlobalsRead;
    effects.mutableGlobalsRead._M_t._M_impl._0_4_ = 0;
    effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)0x0;
    effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&effects.globalsWritten;
    effects.globalsWritten._M_t._M_impl._0_4_ = 0;
    effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&effects.breakTargets;
    effects.breakTargets._M_t._M_impl._0_4_ = 0;
    effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    effects._232_8_ = effects._232_8_ & 0xffffffff00000000;
    effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    effects.trap = false;
    effects.implicitTrap = false;
    effects.isAtomic = false;
    effects.throws_ = false;
    effects._244_4_ = 0;
    effects.tryDepth = 0;
    effects.catchDepth = effects.catchDepth & 0xffffffffffffff00;
    effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    in_RCX = (Expression *)&effects.delegateTargets;
    effects.delegateTargets._M_t._M_impl._0_4_ = 0;
    effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)in_RCX;
    effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)in_RCX
    ;
    EffectAnalyzer::visit((EffectAnalyzer *)local_1c8,curr);
    auStack_338 = (undefined1  [8])0x0;
    invalidated.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    invalidated.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    p_Var25 = (this->activeOriginals)._M_h._M_before_begin._M_nxt;
    if (p_Var25 != (_Hash_node_base *)0x0) {
      do {
        curr_local = (Expression *)p_Var25[1]._M_nxt;
        bVar23 = EffectAnalyzer::invalidates
                           ((EffectAnalyzer *)local_1c8,(EffectAnalyzer *)(p_Var25 + 3));
        if (bVar23) {
          if (invalidated.
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_start ==
              invalidated.
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_338,
                       (iterator)
                       invalidated.
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                       _M_impl.super__Vector_impl_data._M_start,&curr_local);
          }
          else {
            *invalidated.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
             ._M_impl.super__Vector_impl_data._M_start = curr_local;
            invalidated.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 invalidated.
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
                 .super__Vector_impl_data._M_start + 1;
          }
        }
        p_Var25 = p_Var25->_M_nxt;
      } while (p_Var25 != (_Hash_node_base *)0x0);
    }
    ppEVar20 = invalidated.
               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (auStack_338 !=
        (undefined1  [8])
        invalidated.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      auVar37 = auStack_338;
      do {
        in_RCX = *(Expression **)auVar37;
        uVar32 = (this->activeOriginals)._M_h._M_bucket_count;
        uVar31 = (ulong)in_RCX % uVar32;
        p_Var35 = (this->activeOriginals)._M_h._M_buckets[uVar31];
        p_Var24 = (__node_base_ptr)0x0;
        if ((p_Var35 != (__node_base_ptr)0x0) &&
           (p_Var24 = p_Var35, p_Var36 = p_Var35->_M_nxt,
           in_RCX != (Expression *)p_Var35->_M_nxt[1]._M_nxt)) {
          while (p_Var25 = p_Var36->_M_nxt, p_Var25 != (_Hash_node_base *)0x0) {
            p_Var24 = (__node_base_ptr)0x0;
            if (((ulong)p_Var25[1]._M_nxt % uVar32 != uVar31) ||
               (p_Var24 = p_Var36, p_Var36 = p_Var25, in_RCX == (Expression *)p_Var25[1]._M_nxt))
            goto LAB_0077e9fd;
          }
          p_Var24 = (__node_base_ptr)0x0;
        }
LAB_0077e9fd:
        if (p_Var24 == (__node_base_ptr)0x0) {
          p_Var25 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var25 = p_Var24->_M_nxt;
        }
        curr_local = in_RCX;
        if (p_Var25 == (_Hash_node_base *)0x0) {
          std::__throw_out_of_range("_Map_base::at");
        }
        iVar9 = *(int *)&p_Var25[2]._M_nxt;
        pmVar26 = std::
                  unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                  ::operator[](&this->requestInfos->
                                super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                               ,&curr_local);
        pmVar26->requests = pmVar26->requests - iVar9;
        pmVar26 = std::
                  unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                  ::operator[](&this->requestInfos->
                                super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                               ,&curr_local);
        if (pmVar26->requests == 0) {
          std::
          unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
          ::erase(&this->requestInfos->
                   super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                  ,&curr_local);
        }
        std::
        unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>_>
        ::erase((unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>_>
                 *)original,&curr_local);
        auVar37 = (undefined1  [8])((long)auVar37 + 8);
      } while (auVar37 != (undefined1  [8])ppEVar20);
    }
    if (auStack_338 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_338,
                      (long)invalidated.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_338);
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&effects.danglingPop);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&effects.features);
    if (effects.funcEffectsMap.
        super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 effects.funcEffectsMap.
                 super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
    }
  }
  _Var33._M_nxt = local_48._M_nxt;
  uVar32 = (this->requestInfos->
           super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
           )._M_h._M_bucket_count;
  pEVar30 = (Expression *)((ulong)local_48._M_nxt % uVar32);
  p_Var35 = (this->requestInfos->
            super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
            )._M_h._M_buckets[(long)pEVar30];
  p_Var24 = (__node_base_ptr)0x0;
  if ((p_Var35 != (__node_base_ptr)0x0) &&
     (p_Var25 = p_Var35->_M_nxt, p_Var24 = p_Var35,
     (Expression *)local_48._M_nxt != (Expression *)p_Var35->_M_nxt[1]._M_nxt)) {
    while (p_Var35 = p_Var25, p_Var25 = p_Var35->_M_nxt, in_RCX = pEVar30,
          p_Var25 != (_Hash_node_base *)0x0) {
      p_Var24 = (__node_base_ptr)0x0;
      if (((Expression *)((ulong)p_Var25[1]._M_nxt % uVar32) != pEVar30) ||
         (p_Var24 = p_Var35, (Expression *)local_48._M_nxt == (Expression *)p_Var25[1]._M_nxt))
      goto LAB_0077eb39;
    }
    p_Var24 = (__node_base_ptr)0x0;
  }
LAB_0077eb39:
  if (p_Var24 == (__node_base_ptr)0x0) {
    __n_02 = (__node_ptr)0x0;
  }
  else {
    __n_02 = (__node_ptr)p_Var24->_M_nxt;
  }
  if (__n_02 != (__node_ptr)0x0) {
    this_00 = (RequestInfo *)
              ((long)&(__n_02->
                      super__Hash_node_value<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                      ).
                      super__Hash_node_value_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>
                      ._M_storage._M_storage + 8);
    RequestInfo::validate(this_00);
    if (*(int *)((long)&(__n_02->
                        super__Hash_node_value<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                        ).
                        super__Hash_node_value_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>
                        ._M_storage._M_storage + 8) == 0) {
      uVar32 = *(ulong *)((long)&(__n_02->
                                 super__Hash_node_value<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                                 ).
                                 super__Hash_node_value_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>
                                 ._M_storage._M_storage + 0x10);
      if (uVar32 != 0) {
        __k = (key_type *)
              ((long)&(__n_02->
                      super__Hash_node_value<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                      ).
                      super__Hash_node_value_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>
                      ._M_storage._M_storage + 0x10);
        p_Var25 = (_Hash_node_base *)0x0;
        p_Var28 = std::
                  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::_M_find_before_node
                            ((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                              *)original,uVar32 % (this->activeOriginals)._M_h._M_bucket_count,__k,
                             (__hash_code)in_RCX);
        if (p_Var28 != (__node_base_ptr)0x0) {
          p_Var25 = p_Var28->_M_nxt;
        }
        if (p_Var25 == (_Hash_node_base *)0x0) {
          this_01 = (_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)this->requestInfos;
          uVar32 = *(ulong *)&(__n_02->
                              super__Hash_node_value<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>
                              ._M_storage._M_storage % this_01->_M_bucket_count;
          p_Var11 = (__node_ptr)this_01->_M_buckets[uVar32];
          do {
            __prev_n = p_Var11;
            p_Var11 = (__node_ptr)(__prev_n->super__Hash_node_base)._M_nxt;
          } while (p_Var11 != __n_02);
          std::
          _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::_M_erase(this_01,uVar32,&__prev_n->super__Hash_node_base,__n_02);
        }
        else if (*(int *)&p_Var25[2]._M_nxt == 1) {
          std::
          unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>_>
          ::erase((unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>_>
                   *)original,__k);
        }
        else {
          *(int *)&p_Var25[2]._M_nxt = *(int *)&p_Var25[2]._M_nxt + -1;
        }
      }
    }
    else {
      EffectAnalyzer::EffectAnalyzer
                ((EffectAnalyzer *)auStack_338,this->options,
                 (this->
                 super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                 ).
                 super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                 .currModule,(Expression *)_Var33._M_nxt);
      bStack_248 = false;
      if ((((((local_2e0._M_impl.super__Rb_tree_header._M_node_count != 0) || (local_230 != false))
            || (local_280._M_impl.super__Rb_tree_header._M_node_count != 0)) ||
           ((bStack_24f != false || (bStack_24d != false)))) ||
          (((bStack_24b != false || ((bStack_249 != false || (bStack_246 != false)))) ||
           (local_313 != false)))) ||
         ((((bStack_245 != false || (local_1f8._M_impl.super__Rb_tree_header._M_node_count != 0)) ||
           (local_314 != false)) ||
          ((local_228._M_impl.super__Rb_tree_header._M_node_count != 0 ||
           (bVar23 = Properties::isGenerative
                               ((Expression *)_Var33._M_nxt,
                                (FeatureSet)
                                (((this->
                                  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                                  ).
                                  super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                                  .
                                  super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                                 .currModule)->features).features), auVar37 = auStack_338, bVar23)))
          ))) {
        std::
        unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
        ::erase(&this->requestInfos->
                 super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                ,(key_type *)&local_48);
      }
      else {
        local_1c8._0_4_ = this_00->requests;
        p_Var2 = &effects.localsRead._M_t._M_impl.super__Rb_tree_header;
        effects.ignoreImplicitTraps = (bool)auStack_338[0];
        effects.trapsNeverHappen = (bool)auStack_338[1];
        effects.funcEffectsMap.
        super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)
                  invalidated.
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        effects.funcEffectsMap.
        super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             invalidated.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        invalidated.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        invalidated.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        effects.module._0_4_ =
             (uint32_t)
             invalidated.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_6_;
        effects.module._4_2_ =
             (undefined2)
             ((uint6)invalidated.
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._0_6_ >> 0x20);
        effects.module._6_2_ =
             invalidated.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_;
        effects._32_6_ = ZEXT46(FStack_318.features);
        if (local_310._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
          psVar18 = &effects.localsRead;
          effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               (ulong)(uint)effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ <<
               0x20;
          effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
          ;
          effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &p_Var2->_M_header;
          effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               &p_Var2->_M_header;
        }
        else {
          p_Var3 = &local_310._M_impl.super__Rb_tree_header;
          effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               local_310._M_impl.super__Rb_tree_header._M_header._M_color;
          effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               local_310._M_impl.super__Rb_tree_header._M_header._M_parent;
          effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               local_310._M_impl.super__Rb_tree_header._M_header._M_left;
          effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_310._M_impl.super__Rb_tree_header._M_header._M_right;
          (local_310._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
               &p_Var2->_M_header;
          psVar18 = (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    &local_310;
          effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count =
               local_310._M_impl.super__Rb_tree_header._M_node_count;
          local_310._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_310._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
          local_310._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
        }
        (psVar18->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
        p_Var3 = &effects.localsWritten._M_t._M_impl.super__Rb_tree_header;
        if (local_2e0._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
          psVar18 = &effects.localsWritten;
          effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               (ulong)(uint)effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_
               << 0x20;
          effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &p_Var3->_M_header;
          effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               &p_Var3->_M_header;
        }
        else {
          p_Var4 = &local_2e0._M_impl.super__Rb_tree_header;
          effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               local_2e0._M_impl.super__Rb_tree_header._M_header._M_color;
          effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               local_2e0._M_impl.super__Rb_tree_header._M_header._M_parent;
          effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               local_2e0._M_impl.super__Rb_tree_header._M_header._M_left;
          effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_2e0._M_impl.super__Rb_tree_header._M_header._M_right;
          (local_2e0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
               &p_Var3->_M_header;
          psVar18 = (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    &local_2e0;
          effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count =
               local_2e0._M_impl.super__Rb_tree_header._M_node_count;
          local_2e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_2e0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
          local_2e0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
        }
        (psVar18->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
        p_Var4 = &effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header;
        if (local_2b0._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
          psVar19 = &effects.mutableGlobalsRead;
          effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               (ulong)(uint)effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header.
                            _4_4_ << 0x20;
          effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &p_Var4->_M_header;
          effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               &p_Var4->_M_header;
        }
        else {
          p_Var5 = &local_2b0._M_impl.super__Rb_tree_header;
          effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               local_2b0._M_impl.super__Rb_tree_header._M_header._M_color;
          effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               local_2b0._M_impl.super__Rb_tree_header._M_header._M_parent;
          effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               local_2b0._M_impl.super__Rb_tree_header._M_header._M_left;
          effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_2b0._M_impl.super__Rb_tree_header._M_header._M_right;
          (local_2b0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
               &p_Var4->_M_header;
          psVar19 = (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                    &local_2b0;
          effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_node_count =
               local_2b0._M_impl.super__Rb_tree_header._M_node_count;
          local_2b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_2b0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var5->_M_header;
          local_2b0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var5->_M_header;
        }
        (psVar19->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
        p_Var5 = &effects.globalsWritten._M_t._M_impl.super__Rb_tree_header;
        if (local_280._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
          psVar19 = &effects.globalsWritten;
          effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               (ulong)(uint)effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header.
                            _4_4_ << 0x20;
          effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &p_Var5->_M_header;
          effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               &p_Var5->_M_header;
        }
        else {
          p_Var6 = &local_280._M_impl.super__Rb_tree_header;
          effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               local_280._M_impl.super__Rb_tree_header._M_header._M_color;
          effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               local_280._M_impl.super__Rb_tree_header._M_header._M_parent;
          effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               local_280._M_impl.super__Rb_tree_header._M_header._M_left;
          effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_280._M_impl.super__Rb_tree_header._M_header._M_right;
          (local_280._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
               &p_Var5->_M_header;
          psVar19 = (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                    &local_280;
          effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count =
               local_280._M_impl.super__Rb_tree_header._M_node_count;
          local_280._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_280._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var6->_M_header;
          local_280._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var6->_M_header;
        }
        (psVar19->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
        p_Var5 = &effects.breakTargets._M_t._M_impl.super__Rb_tree_header;
        effects.danglingPop = local_230;
        effects.writesMemory = bStack_24f;
        effects.readsMemory = local_250;
        effects.readsTable = bStack_24e;
        effects.writesTable = bStack_24d;
        effects.readsMutableStruct = bStack_24c;
        effects.writesStruct = bStack_24b;
        effects.readsArray = bStack_24a;
        effects.writesArray = bStack_249;
        effects.implicitTrap = bStack_247;
        effects.trap = bStack_248;
        effects.isAtomic = bStack_246;
        effects.throws_ = bStack_245;
        effects._244_4_ = uStack_244;
        effects.tryDepth = local_240;
        effects.catchDepth = sStack_238;
        if (local_228._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
          psVar19 = &effects.breakTargets;
          effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               (ulong)(uint)effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_
               << 0x20;
          effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &p_Var5->_M_header;
          effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               &p_Var5->_M_header;
        }
        else {
          p_Var6 = &local_228._M_impl.super__Rb_tree_header;
          effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               local_228._M_impl.super__Rb_tree_header._M_header._M_color;
          effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               local_228._M_impl.super__Rb_tree_header._M_header._M_parent;
          effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               local_228._M_impl.super__Rb_tree_header._M_header._M_left;
          effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_228._M_impl.super__Rb_tree_header._M_header._M_right;
          (local_228._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
               &p_Var5->_M_header;
          psVar19 = (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                    &local_228;
          effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
               local_228._M_impl.super__Rb_tree_header._M_node_count;
          local_228._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_228._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var6->_M_header;
          local_228._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var6->_M_header;
        }
        (psVar19->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
        p_Var5 = &effects.delegateTargets._M_t._M_impl.super__Rb_tree_header;
        if (local_1f8._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
          psVar19 = &effects.delegateTargets;
          effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               (ulong)(uint)effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                            _4_4_ << 0x20;
          effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &p_Var5->_M_header;
          effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               &p_Var5->_M_header;
        }
        else {
          p_Var6 = &local_1f8._M_impl.super__Rb_tree_header;
          effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               local_1f8._M_impl.super__Rb_tree_header._M_header._M_color;
          effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               local_1f8._M_impl.super__Rb_tree_header._M_header._M_parent;
          effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               local_1f8._M_impl.super__Rb_tree_header._M_header._M_left;
          effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_1f8._M_impl.super__Rb_tree_header._M_header._M_right;
          (local_1f8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
               &p_Var5->_M_header;
          psVar19 = (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                    &local_1f8;
          effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
               local_1f8._M_impl.super__Rb_tree_header._M_node_count;
          local_1f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_1f8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var6->_M_header;
          local_1f8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var6->_M_header;
        }
        (psVar19->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
        auStack_338 = auVar37;
        this_02 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
                   *)operator_new(0x188);
        _Var22 = effects.funcEffectsMap.
                 super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount;
        *(_Hash_node_base **)&this_02->field_0x0 = (_Hash_node_base *)0x0;
        *(_Hash_node_base **)&this_02[8].field_0x0 = local_48._M_nxt;
        *(undefined4 *)&this_02[0x10].field_0x0 = local_1c8._0_4_;
        *(undefined2 *)&this_02[0x18].field_0x0 = effects._0_2_;
        *(_Hash_node_base **)&this_02[0x28].field_0x0 = (_Hash_node_base *)0x0;
        effects.funcEffectsMap.
        super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        *(element_type **)&this_02[0x20].field_0x0 =
             effects.funcEffectsMap.
             super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this_02[0x28].field_0x0 = _Var22._M_pi;
        effects.funcEffectsMap.
        super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        *(ulong *)(this_02 + 0x36) = CONCAT62(effects._32_6_,effects.module._6_2_);
        *(_Hash_node_base **)&this_02[0x30].field_0x0 =
             (_Hash_node_base *)
             CONCAT26(effects.module._6_2_,CONCAT24(effects.module._4_2_,(uint32_t)effects.module));
        p_Var1 = (_Base_ptr)(this_02 + 0x48);
        if (effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
            (_Base_ptr)0x0) {
          *(undefined4 *)&this_02[0x48].field_0x0 = 0;
          *(_Hash_node_base **)&this_02[0x50].field_0x0 = (_Hash_node_base *)0x0;
          *(_Base_ptr *)&this_02[0x58].field_0x0 = p_Var1;
          *(_Base_ptr *)&this_02[0x60].field_0x0 = p_Var1;
          p_Var27 = this_02 + 0x68;
        }
        else {
          p_Var27 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
                     *)&effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count;
          *(_Rb_tree_color *)&this_02[0x48].field_0x0 =
               effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
          *(_Base_ptr *)&this_02[0x50].field_0x0 =
               effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          *(_Base_ptr *)&this_02[0x58].field_0x0 =
               effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          *(_Base_ptr *)&this_02[0x60].field_0x0 =
               effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          (effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
               p_Var1;
          *(size_t *)&this_02[0x68].field_0x0 =
               effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count;
          effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
          ;
          effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &p_Var2->_M_header;
          effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               &p_Var2->_M_header;
        }
        *(size_t *)p_Var27 = 0;
        p_Var1 = (_Base_ptr)(this_02 + 0x78);
        if (effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
            (_Base_ptr)0x0) {
          *(undefined4 *)&this_02[0x78].field_0x0 = 0;
          *(_Hash_node_base **)&this_02[0x80].field_0x0 = (_Hash_node_base *)0x0;
          *(_Base_ptr *)&this_02[0x88].field_0x0 = p_Var1;
          *(_Base_ptr *)&this_02[0x90].field_0x0 = p_Var1;
          p_Var27 = this_02 + 0x98;
        }
        else {
          p_Var27 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
                     *)&effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count;
          *(_Rb_tree_color *)&this_02[0x78].field_0x0 =
               effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
          *(_Base_ptr *)&this_02[0x80].field_0x0 =
               effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          *(_Base_ptr *)&this_02[0x88].field_0x0 =
               effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          *(_Base_ptr *)&this_02[0x90].field_0x0 =
               effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          (effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent
               = p_Var1;
          *(size_t *)&this_02[0x98].field_0x0 =
               effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count;
          effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &p_Var3->_M_header;
          effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               &p_Var3->_M_header;
        }
        *(size_t *)p_Var27 = 0;
        p_Var1 = (_Base_ptr)(this_02 + 0xa8);
        if (effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
            (_Base_ptr)0x0) {
          *(undefined4 *)&this_02[0xa8].field_0x0 = 0;
          *(_Hash_node_base **)&this_02[0xb0].field_0x0 = (_Hash_node_base *)0x0;
          *(_Base_ptr *)&this_02[0xb8].field_0x0 = p_Var1;
          *(_Base_ptr *)&this_02[0xc0].field_0x0 = p_Var1;
          p_Var27 = this_02 + 200;
        }
        else {
          p_Var27 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
                     *)&effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_node_count;
          *(_Rb_tree_color *)&this_02[0xa8].field_0x0 =
               effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
          *(_Base_ptr *)&this_02[0xb0].field_0x0 =
               effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          *(_Base_ptr *)&this_02[0xb8].field_0x0 =
               effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          *(_Base_ptr *)&this_02[0xc0].field_0x0 =
               effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          (effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
          _M_parent = p_Var1;
          *(size_t *)&this_02[200].field_0x0 =
               effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_node_count;
          effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &p_Var4->_M_header;
          effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               &p_Var4->_M_header;
        }
        *(size_t *)p_Var27 = 0;
        p_Var1 = (_Base_ptr)(this_02 + 0xd8);
        if (effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
            (_Base_ptr)0x0) {
          *(undefined4 *)&this_02[0xd8].field_0x0 = 0;
          *(_Hash_node_base **)&this_02[0xe0].field_0x0 = (_Hash_node_base *)0x0;
          *(_Base_ptr *)&this_02[0xe8].field_0x0 = p_Var1;
          *(_Base_ptr *)&this_02[0xf0].field_0x0 = p_Var1;
          p_Var27 = this_02 + 0xf8;
        }
        else {
          p_Var27 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
                     *)&effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count;
          *(_Rb_tree_color *)&this_02[0xd8].field_0x0 =
               effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
          *(_Base_ptr *)&this_02[0xe0].field_0x0 =
               effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          *(_Base_ptr *)&this_02[0xe8].field_0x0 =
               effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          *(_Base_ptr *)&this_02[0xf0].field_0x0 =
               effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          (effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent
               = p_Var1;
          *(size_t *)&this_02[0xf8].field_0x0 =
               effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count;
          effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header;
          effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        *(size_t *)p_Var27 = 0;
        this_02[0x120].field_0x0 = effects.danglingPop;
        *(size_t *)&this_02[0x110].field_0x0 = effects.tryDepth;
        *(size_t *)&this_02[0x118].field_0x0 = effects.catchDepth;
        *(undefined8 *)&this_02[0x100].field_0x0 = effects._232_8_;
        *(undefined8 *)&this_02[0x108].field_0x0 = effects._240_8_;
        p_Var1 = (_Base_ptr)(this_02 + 0x130);
        if (effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
            (_Base_ptr)0x0) {
          *(undefined4 *)&this_02[0x130].field_0x0 = 0;
          *(_Hash_node_base **)&this_02[0x138].field_0x0 = (_Hash_node_base *)0x0;
          *(_Base_ptr *)&this_02[0x140].field_0x0 = p_Var1;
          *(_Base_ptr *)&this_02[0x148].field_0x0 = p_Var1;
          p_Var27 = this_02 + 0x150;
        }
        else {
          p_Var27 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
                     *)&effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
          *(_Rb_tree_color *)&this_02[0x130].field_0x0 =
               effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
          *(_Base_ptr *)&this_02[0x138].field_0x0 =
               effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          *(_Base_ptr *)&this_02[0x140].field_0x0 =
               effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          *(_Base_ptr *)&this_02[0x148].field_0x0 =
               effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          (effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
               p_Var1;
          *(size_t *)&this_02[0x150].field_0x0 =
               effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
          effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header;
          effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        __k_00 = this_02 + 8;
        *(size_t *)p_Var27 = 0;
        p_Var1 = (_Base_ptr)(this_02 + 0x160);
        if (effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
            (_Base_ptr)0x0) {
          *(undefined4 *)&this_02[0x160].field_0x0 = 0;
          *(_Hash_node_base **)&this_02[0x168].field_0x0 = (_Hash_node_base *)0x0;
          *(_Base_ptr *)&this_02[0x170].field_0x0 = p_Var1;
          *(_Base_ptr *)&this_02[0x178].field_0x0 = p_Var1;
          p_Var27 = this_02 + 0x180;
        }
        else {
          p_Var27 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
                     *)&effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
          *(_Rb_tree_color *)&this_02[0x160].field_0x0 =
               effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
          *(_Base_ptr *)&this_02[0x168].field_0x0 =
               effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          *(_Base_ptr *)&this_02[0x170].field_0x0 =
               effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          *(_Base_ptr *)&this_02[0x178].field_0x0 =
               effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          (effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
          _M_parent = p_Var1;
          *(size_t *)&this_02[0x180].field_0x0 =
               effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
          effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header;
          effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        *(size_t *)p_Var27 = 0;
        pEVar12 = *(key_type *)&__k_00->field_0x0;
        p_Var34 = (__node_ptr)(this->activeOriginals)._M_h._M_bucket_count;
        __bkt = (__node_ptr)((ulong)pEVar12 % (ulong)p_Var34);
        __n_01 = __bkt;
        p_Var28 = std::
                  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::_M_find_before_node
                            ((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                              *)original,(size_type)__bkt,(key_type *)__k_00,(__hash_code)__k_00);
        if ((p_Var28 == (__node_base_ptr)0x0) || (p_Var28->_M_nxt == (_Hash_node_base *)0x0)) {
          auVar38 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                              ((ulong)&(this->activeOriginals)._M_h._M_rehash_policy,(ulong)p_Var34,
                               (this->activeOriginals)._M_h._M_element_count);
          __n_00 = auVar38._8_8_;
          if ((auVar38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            if (__n_00 == 1) {
              __s = &(this->activeOriginals)._M_h._M_single_bucket;
              (this->activeOriginals)._M_h._M_single_bucket = (__node_base_ptr)0x0;
            }
            else {
              __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                              ((new_allocator<std::__detail::_Hash_node_base_*> *)&curr_local,__n_00
                               ,(void *)0x0);
              memset(__s,0,__n_00 * 8);
            }
            p_Var34 = (__node_ptr)(this->activeOriginals)._M_h._M_before_begin._M_nxt;
            (this->activeOriginals)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            if (p_Var34 != (__node_ptr)0x0) {
              p_Var7 = &(this->activeOriginals)._M_h._M_before_begin;
              _Var33._M_nxt = (_Hash_node_base *)p_Var34;
              uVar32 = 0;
              do {
                p_Var34 = (__node_ptr)(_Var33._M_nxt)->_M_nxt;
                uVar31 = (ulong)_Var33._M_nxt[1]._M_nxt % __n_00;
                if (__s[uVar31] == (_Hash_node_base *)0x0) {
                  (_Var33._M_nxt)->_M_nxt = p_Var7->_M_nxt;
                  p_Var7->_M_nxt = _Var33._M_nxt;
                  __s[uVar31] = p_Var7;
                  if ((_Var33._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                    pp_Var29 = __s + uVar32;
                    goto LAB_0077f557;
                  }
                }
                else {
                  (_Var33._M_nxt)->_M_nxt = __s[uVar31]->_M_nxt;
                  pp_Var29 = &__s[uVar31]->_M_nxt;
                  uVar31 = uVar32;
LAB_0077f557:
                  *pp_Var29 = _Var33._M_nxt;
                }
                _Var33._M_nxt = (_Hash_node_base *)p_Var34;
                uVar32 = uVar31;
              } while (p_Var34 != (__node_ptr)0x0);
            }
            pp_Var13 = (this->activeOriginals)._M_h._M_buckets;
            if (&(this->activeOriginals)._M_h._M_single_bucket != pp_Var13) {
              p_Var34 = (__node_ptr)((this->activeOriginals)._M_h._M_bucket_count << 3);
              operator_delete(pp_Var13,(ulong)p_Var34);
            }
            (this->activeOriginals)._M_h._M_bucket_count = __n_00;
            (this->activeOriginals)._M_h._M_buckets = __s;
            __bkt = (__node_ptr)((ulong)pEVar12 % __n_00);
          }
          lVar14 = *(long *)original;
          puVar15 = *(undefined8 **)(lVar14 + (long)__bkt * 8);
          if (puVar15 == (undefined8 *)0x0) {
            p_Var34 = (__node_ptr)&(this->activeOriginals)._M_h._M_before_begin;
            p_Var25 = (this->activeOriginals)._M_h._M_before_begin._M_nxt;
            *(_Hash_node_base **)&this_02->field_0x0 = p_Var25;
            (this->activeOriginals)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)this_02;
            if (p_Var25 != (_Hash_node_base *)0x0) {
              *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
                **)(lVar14 + ((ulong)p_Var25[1]._M_nxt %
                             (this->activeOriginals)._M_h._M_bucket_count) * 8) = this_02;
            }
            *(__node_ptr *)(*(long *)original + (long)__bkt * 8) = p_Var34;
          }
          else {
            *(_Hash_node_base **)&this_02->field_0x0 = (_Hash_node_base *)*puVar15;
            **(undefined8 **)(lVar14 + (long)__bkt * 8) = this_02;
          }
          psVar8 = &(this->activeOriginals)._M_h._M_element_count;
          *psVar8 = *psVar8 + 1;
          this_02 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
                     *)0x0;
          __n_01 = p_Var34;
        }
        if (this_02 !=
            (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
             *)0x0) {
          std::__detail::
          _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
          ::_M_deallocate_node(this_02,__n_01);
        }
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree(&effects.delegateTargets._M_t);
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree(&effects.breakTargets._M_t);
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree(&effects.globalsWritten._M_t);
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree(&effects.mutableGlobalsRead._M_t);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree(&effects.localsWritten._M_t);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree(&effects.localsRead._M_t);
        if (effects.funcEffectsMap.
            super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (effects.funcEffectsMap.
                     super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
      }
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_1f8);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_228);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_280);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_2b0);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_2e0);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_310);
      if (invalidated.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   invalidated.
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
      }
    }
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    // This is the first time we encounter this expression.
    assert(!activeOriginals.count(curr));

    // Given the current expression, see what it invalidates of the currently-
    // hashed expressions, if there are any.
    if (!activeOriginals.empty()) {
      EffectAnalyzer effects(options, *getModule());
      // We only need to visit this node itself, as we have already visited its
      // children by the time we get here.
      effects.visit(curr);

      std::vector<Expression*> invalidated;
      for (auto& kv : activeOriginals) {
        auto* original = kv.first;
        auto& originalInfo = kv.second;
        if (effects.invalidates(originalInfo.effects)) {
          invalidated.push_back(original);
        }
      }

      for (auto* original : invalidated) {
        // Remove all requests after this expression, as we cannot optimize to
        // them.
        requestInfos[original].requests -=
          activeOriginals.at(original).requestsLeft;

        // If no requests remain at all (that is, there were no requests we
        // could provide before we ran into this invalidation) then we do not
        // need this original at all.
        if (requestInfos[original].requests == 0) {
          requestInfos.erase(original);
        }

        activeOriginals.erase(original);
      }
    }

    auto iter = requestInfos.find(curr);
    if (iter == requestInfos.end()) {
      return;
    }
    auto& info = iter->second;
    info.validate();

    if (info.requests > 0) {
      // This is an original. Compute its side effects, as we cannot optimize
      // away repeated apperances if it has any.
      EffectAnalyzer effects(options, *getModule(), curr);

      // We can ignore traps here, as we replace a repeating expression with a
      // single appearance of it, a store to a local, and gets in the other
      // locations, and so if the expression traps then the first appearance -
      // that we keep around - would trap, and the others are never reached
      // anyhow. (The other checks we perform here, including invalidation and
      // determinism, will ensure that either all of the appearances trap, or
      // none of them.)
      effects.trap = false;

      // We also cannot optimize away something that is intrinsically
      // nondeterministic: even if it has no side effects, if it may return a
      // different result each time, then we cannot optimize away repeats.
      if (effects.hasSideEffects() ||
          Properties::isGenerative(curr, getModule()->features)) {
        requestInfos.erase(curr);
      } else {
        activeOriginals.emplace(
          curr, ActiveOriginalInfo{info.requests, std::move(effects)});
      }
    } else if (info.original) {
      // The original may have already been invalidated. If so, remove our info
      // as well.
      auto originalIter = activeOriginals.find(info.original);
      if (originalIter == activeOriginals.end()) {
        requestInfos.erase(iter);
        return;
      }

      // After visiting this expression, we have one less request for its
      // original, and perhaps none are left.
      auto& originalInfo = originalIter->second;
      if (originalInfo.requestsLeft == 1) {
        activeOriginals.erase(info.original);
      } else {
        originalInfo.requestsLeft--;
      }
    }
  }